

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O0

bool remote::WriteProcessMemory
               (Handle hProcess,void *lpBaseAddress,void *lpBuffer,size_t nSize,
               size_t *lpNumberOfBytesWritten)

{
  bool bVar1;
  size_t sVar2;
  ssize_t result;
  undefined1 local_a8 [8];
  Region reg;
  size_t *lpNumberOfBytesWritten_local;
  size_t nSize_local;
  void *lpBuffer_local;
  void *lpBaseAddress_local;
  Handle hProcess_local;
  
  reg.filename.field_2._8_8_ = lpNumberOfBytesWritten;
  lpBaseAddress_local._0_4_ = hProcess.pid;
  bVar1 = Handle::IsRunning((Handle *)&lpBaseAddress_local);
  if (bVar1) {
    Handle::GetRegionByAddress
              ((Region *)local_a8,(Handle *)&lpBaseAddress_local,(size_t)lpBaseAddress);
    if ((long)local_a8 + reg.start == 0) {
      lpBaseAddress_local._7_1_ = false;
    }
    else {
      sVar2 = Handle::WriteMemory((Handle *)&lpBaseAddress_local,lpBaseAddress,lpBuffer,nSize);
      if (sVar2 == 0xffffffffffffffff) {
        lpBaseAddress_local._7_1_ = false;
      }
      else {
        if (reg.filename.field_2._8_8_ != 0) {
          *(size_t *)reg.filename.field_2._8_8_ = sVar2;
        }
        lpBaseAddress_local._7_1_ = sVar2 == nSize;
      }
    }
    Region::~Region((Region *)local_a8);
  }
  else {
    lpBaseAddress_local._7_1_ = 0;
  }
  return (bool)(lpBaseAddress_local._7_1_ & 1);
}

Assistant:

bool remote::WriteProcessMemory(Handle hProcess, void* lpBaseAddress, void* lpBuffer, size_t nSize, size_t* lpNumberOfBytesWritten) {
    if(!hProcess.IsRunning())
        return false;

    // Try to prevent them reading or writing to invalid memory
    Region reg = hProcess.GetRegionByAddress((size_t) lpBaseAddress);

    if(reg.start + reg.end == 0)
        return false;

    ssize_t result = hProcess.WriteMemory(lpBaseAddress, lpBuffer, nSize);

    if(result == -1)
        return false;

    if(lpNumberOfBytesWritten)
        *lpNumberOfBytesWritten = (size_t) result;

    return (((size_t) result) == nSize);
}